

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.h
# Opt level: O1

void __thiscall soplex::SPxFastRT<double>::setDelta(SPxFastRT<double> *this,double newDelta)

{
  Tolerances *pTVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Real RVar3;
  
  pTVar1 = (this->super_SPxRatioTester<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (this->super_SPxRatioTester<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  RVar3 = Tolerances::epsilon(pTVar1);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (newDelta <= RVar3) {
    pTVar1 = (this->super_SPxRatioTester<double>)._tolerances.
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (this->super_SPxRatioTester<double>)._tolerances.
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    newDelta = Tolerances::epsilon(pTVar1);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  (this->super_SPxRatioTester<double>).delta = newDelta;
  this->fastDelta = newDelta;
  return;
}

Assistant:

virtual void setDelta(R newDelta)
   {
      if(newDelta <= this->tolerances()->epsilon())
         newDelta = this->tolerances()->epsilon();

      this->delta = newDelta;
      fastDelta = newDelta;
   }